

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O3

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeRTBase::checkResults
          (TextureCubeMapArrayTextureSizeRTBase *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType)

{
  ostringstream *poVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *pcVar6;
  GLboolean GVar7;
  GLuint read_size [4];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  STORAGE_TYPE local_1c8;
  GLuint local_1c4;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  local_1c0 = CONCAT44(local_1c0._4_4_,depth);
  local_1c8 = storType;
  iVar3 = (*((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_1d8 = 0;
  uStack_1d0 = 0;
  (**(code **)(lVar5 + 0x78))(0x8ca8,this->m_read_fbo_id);
  (**(code **)(lVar5 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_std_id,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x49f);
  checkFramebufferStatus(this,0x8ca8);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x8d99,0x1405,&local_1d8);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4a5);
  local_1b8 = (ulong)width;
  uVar2 = (uint)local_1c0;
  local_1c4 = height;
  if ((((GLuint)local_1d8 != width) || (local_1d8._4_4_ != height)) ||
     (GVar7 = '\x01', (uint)uStack_1d0 != (uint)local_1c0 / 6)) {
    local_1b0._0_8_ =
         ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Storage Type: ",0xe);
    pcVar6 = "IMMUTABLE";
    if (local_1c8 == ST_MUTABLE) {
      pcVar6 = "MUTABLE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,pcVar6,(ulong)(local_1c8 != ST_MUTABLE) * 2 + 7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "textureSize() for samplerCubeArray returned wrong values of [width][height][layers]. They are equal to"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] but should be ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    GVar7 = '\0';
  }
  local_1c0 = (ulong)height;
  (**(code **)(lVar5 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_shw_id,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4b5);
  checkFramebufferStatus(this,0x8ca8);
  (**(code **)(lVar5 + 0x1220))(0,0,1,1,0x8d99,0x1405,&local_1d8);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4bb);
  if ((((GLuint)local_1d8 != width) || (local_1d8._4_4_ != local_1c4)) ||
     ((uint)uStack_1d0 != uVar2 / 6)) {
    local_1b0._0_8_ =
         ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Storage Type: ",0xe);
    pcVar6 = "IMMUTABLE";
    if (local_1c8 == ST_MUTABLE) {
      pcVar6 = "MUTABLE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,pcVar6,(ulong)(local_1c8 != ST_MUTABLE) * 2 + 7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "textureSize() for samplerCubeArrayShadow returned wrong values of [width][height][layers]. They are equal to"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] but should be ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"][",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    GVar7 = '\0';
  }
  return GVar7;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeRTBase::checkResults(glw::GLuint width, glw::GLuint height,
																  glw::GLuint depth, STORAGE_TYPE storType)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;

	glw::GLuint read_size[m_n_rt_components];
	memset(read_size, 0, m_n_rt_components * sizeof(glw::GLuint));

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	/* Compare returned results of textureSize() called for samplerCubeArray sampler*/
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_std_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage) << "\n"
			<< "textureSize() for samplerCubeArray returned wrong values of [width][height][layers]. They are equal to"
			<< "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2] << "] but should be "
			<< "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
			<< tcu::TestLog::EndMessage;
		test_passed = false;
	}

	/* Compare returned results of textureSize() for samplerCubeArrayShadow sampler*/
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_shw_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog() << tcu::TestLog::Message
								  << "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage)
								  << "\n"
								  << "textureSize() for samplerCubeArrayShadow returned wrong values of "
									 "[width][height][layers]. They are equal to"
								  << "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2]
								  << "] but should be "
								  << "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
								  << tcu::TestLog::EndMessage;
		test_passed = false;
	}

	return test_passed;
}